

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_advance(acmod_t *acmod)

{
  int iVar1;
  acmod_t *acmod_local;
  
  iVar1 = acmod->feat_outidx + 1;
  acmod->feat_outidx = iVar1;
  if (iVar1 == acmod->n_feat_alloc) {
    acmod->feat_outidx = 0;
  }
  acmod->n_feat_frame = acmod->n_feat_frame + -1;
  acmod->mgau->frame_idx = acmod->mgau->frame_idx + 1;
  iVar1 = acmod->output_frame + 1;
  acmod->output_frame = iVar1;
  return iVar1;
}

Assistant:

int
acmod_advance(acmod_t *acmod)
{
    /* Advance the output pointers. */
    if (++acmod->feat_outidx == acmod->n_feat_alloc)
        acmod->feat_outidx = 0;
    --acmod->n_feat_frame;
    ++acmod->mgau->frame_idx;

    return ++acmod->output_frame;
}